

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nng.c
# Opt level: O2

int ctx_set(nng_ctx id,char *n,void *v,size_t sz,nni_type t)

{
  int iVar1;
  nni_ctx *in_RAX;
  nni_ctx *local_38;
  nni_ctx *ctx;
  
  local_38 = in_RAX;
  iVar1 = nni_ctx_find(&local_38,id.id);
  if (iVar1 == 0) {
    iVar1 = nni_ctx_setopt(local_38,n,v,sz,t);
    nni_ctx_rele(local_38);
  }
  return iVar1;
}

Assistant:

static int
ctx_set(nng_ctx id, const char *n, const void *v, size_t sz, nni_type t)
{
	nni_ctx *ctx;
	int      rv;

	if ((rv = nni_ctx_find(&ctx, id.id)) != 0) {
		return (rv);
	}
	rv = nni_ctx_setopt(ctx, n, v, sz, t);
	nni_ctx_rele(ctx);
	return (rv);
}